

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

void * pythonInputOpenCallback(char *URI)

{
  undefined *puVar1;
  
  puVar1 = (undefined *)_PyObject_CallFunction_SizeT(pythonInputOpenCallbackObject,"s",URI);
  if (puVar1 == &_Py_NoneStruct) {
    __Py_NoneStruct = __Py_NoneStruct + -1;
    if (__Py_NoneStruct == 0) {
      _Py_Dealloc(&_Py_NoneStruct);
    }
    puVar1 = (undefined *)0x0;
  }
  return puVar1;
}

Assistant:

static void *
pythonInputOpenCallback(const char *URI)
{
    PyObject *ret;

    ret = PyObject_CallFunction(pythonInputOpenCallbackObject,
	    (char *)"s", URI);
    if (ret == Py_None) {
	Py_DECREF(Py_None);
	return NULL;
    }
    return ret;
}